

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_columns.cpp
# Opt level: O0

bool __thiscall
duckdb::SetColumns::IsCandidateUnacceptable
          (SetColumns *this,idx_t num_cols,bool null_padding,bool ignore_errors,
          bool last_value_always_empty)

{
  bool bVar1;
  idx_t iVar2;
  byte in_CL;
  byte in_DL;
  ulong in_RSI;
  byte in_R8B;
  idx_t size;
  SetColumns *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = IsSet(in_stack_ffffffffffffffc8);
  if ((bVar1) && ((in_CL & 1) == 0)) {
    iVar2 = Size(in_stack_ffffffffffffffc8);
    if ((in_RSI == iVar2) || (in_RSI == iVar2 + (in_R8B & 1))) {
      local_1 = false;
    }
    else if (((in_DL & 1) == 0) || (in_RSI <= iVar2)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SetColumns::IsCandidateUnacceptable(const idx_t num_cols, bool null_padding, bool ignore_errors,
                                         bool last_value_always_empty) const {
	if (!IsSet() || ignore_errors) {
		// We can't say its unacceptable if it's not set or if we ignore errors
		return false;
	}
	idx_t size = Size();
	// If the columns are set and there is a mismatch with the expected number of columns, with null_padding and
	// ignore_errors not set, we don't have a suitable candidate.
	// Note that we compare with max_columns_found + 1, because some broken files have the behaviour where two
	// columns are represented as: | col 1 | col_2 |
	if (num_cols == size || num_cols == size + last_value_always_empty) {
		// Good Candidate
		return false;
	}
	// if we detected more columns than we have set, it's all good because we can null-pad them
	if (null_padding && num_cols > size) {
		return false;
	}
	// Unacceptable
	return true;
}